

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

bool soplex::LPFhasKeyword(char **pos,char *keyword)

{
  char cVar1;
  int iVar2;
  long in_RSI;
  long *in_RDI;
  bool bVar3;
  int k;
  int i;
  int local_20;
  int local_1c;
  bool local_1;
  
  local_20 = 0;
  for (local_1c = 0; *(char *)(in_RSI + local_1c) != '\0'; local_1c = local_1c + 1) {
    if (*(char *)(in_RSI + local_1c) == '[') {
      while( true ) {
        local_1c = local_1c + 1;
        iVar2 = tolower((int)*(char *)(*in_RDI + (long)local_20));
        bVar3 = false;
        if (iVar2 == *(char *)(in_RSI + local_1c)) {
          bVar3 = *(char *)(*in_RDI + (long)local_20) != '\0';
        }
        if (!bVar3) break;
        local_20 = local_20 + 1;
      }
      for (; *(char *)(in_RSI + local_1c) != ']'; local_1c = local_1c + 1) {
      }
      local_20 = local_20 + -1;
    }
    else {
      cVar1 = *(char *)(in_RSI + local_1c);
      iVar2 = tolower((int)*(char *)(*in_RDI + (long)local_20));
      if (cVar1 != iVar2) break;
    }
    local_20 = local_20 + 1;
  }
  if ((*(char *)(in_RSI + local_1c) == '\0') &&
     (((*(char *)(*in_RDI + (long)local_20) == '\0' ||
       (bVar3 = LPFisSpace((int)*(char *)(*in_RDI + (long)local_20)), bVar3)) ||
      (bVar3 = LPFisSense((char *)(*in_RDI + (long)local_20)), bVar3)))) {
    *in_RDI = *in_RDI + (long)local_20;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool LPFhasKeyword(char*& pos, const char* keyword)
{
   int i;
   int k;

   assert(keyword != nullptr);

   for(i = 0, k = 0; keyword[i] != '\0'; i++, k++)
   {
      if(keyword[i] == '[')
      {
         i++;

         // Here we assumed that we have a ']' for the '['.
         while((tolower(pos[k]) == keyword[i]) && (pos[k] != '\0'))
         {
            k++;
            i++;
         }

         while(keyword[i] != ']')
            i++;

         --k;
      }
      else
      {
         if(keyword[i] != tolower(pos[k]))
            break;
      }
   }

   // we have to be at the end of the keyword and the word found on the line also has to end here.  Attention: The
   // LPFisSense is a kludge to allow LPFhasKeyword also to process Inf[inity] keywords in the bounds section.
   if(keyword[i] == '\0' && (pos[k] == '\0' || LPFisSpace(pos[k]) || LPFisSense(&pos[k])))
   {
      pos += k;

      return true;
   }

   return false;
}